

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

HeapExtendedObject * __thiscall
jsonnet::internal::(anonymous_namespace)::Heap::
makeEntity<jsonnet::internal::(anonymous_namespace)::HeapExtendedObject,jsonnet::internal::(anonymous_namespace)::HeapObject*&,jsonnet::internal::(anonymous_namespace)::HeapObject*&>
          (Heap *this,HeapObject **args,HeapObject **args_1)

{
  HeapExtendedObject *this_00;
  value_type pHVar1;
  value_type *in_RDI;
  HeapExtendedObject *r;
  HeapObject *in_stack_ffffffffffffffc8;
  HeapExtendedObject *in_stack_ffffffffffffffd0;
  
  this_00 = (HeapExtendedObject *)operator_new(0x20);
  anon_unknown_0::HeapExtendedObject::HeapExtendedObject
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(HeapObject *)this_00);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)this_00,in_RDI);
  (this_00->super_HeapObject).super_HeapEntity.mark = *(GarbageCollectionMark *)(in_RDI + 2);
  pHVar1 = (value_type)
           std::
           vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
           ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                   *)(in_RDI + 3));
  in_RDI[7] = pHVar1;
  return this_00;
}

Assistant:

T *makeEntity(Args &&... args)
    {
        T *r = new T(std::forward<Args>(args)...);
        entities.push_back(r);
        r->mark = lastMark;
        numEntities = entities.size();
        return r;
    }